

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::FloatDotsTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FloatDotsTexture *this)

{
  FloatTextureHandle *in_R9;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ FloatDotsTexture mapping: %s insideDot: %s outsideDot: %s ]",(char *)this,
             (TextureMapping2DHandle *)&this->insideDot,&this->outsideDot,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatDotsTexture::ToString() const {
    return StringPrintf("[ FloatDotsTexture mapping: %s insideDot: %s outsideDot: %s ]",
                        mapping, insideDot, outsideDot);
}